

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

bool __thiscall
ON_WeightedAverageHash::Read(ON_WeightedAverageHash *this,ON_BinaryArchive *binary_archive)

{
  bool bVar1;
  int local_24;
  int i;
  ON_BinaryArchive *binary_archive_local;
  ON_WeightedAverageHash *this_local;
  
  local_24 = 0;
  while( true ) {
    if (4 < local_24) {
      return true;
    }
    bVar1 = ON_BinaryArchive::ReadPoint(binary_archive,this->m_sum + local_24);
    if (!bVar1) break;
    local_24 = local_24 + 1;
  }
  return false;
}

Assistant:

bool ON_WeightedAverageHash::Read(ON_BinaryArchive& binary_archive)
{
  for (int i = 0; i < dim; i++)
  {
    if (!binary_archive.ReadPoint(m_sum[i]))
      return false;
  }
  return true;
}